

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O0

symbol_list * copy_symbol_list(dmr_C *C,symbol_list *src)

{
  symbol *sym_00;
  symbol *newsym;
  ptr_list_iter symiter__;
  symbol *sym;
  symbol_list *dst;
  symbol_list *src_local;
  dmr_C *C_local;
  
  sym = (symbol *)0x0;
  dst = src;
  src_local = (symbol_list *)C;
  ptrlist_forward_iterator((ptr_list_iter *)&newsym,(ptr_list *)src);
  symiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&newsym);
  while (symiter__._16_8_ != 0) {
    sym_00 = copy_symbol((dmr_C *)src_local,*(position *)(symiter__._16_8_ + 4),
                         (symbol *)symiter__._16_8_);
    dmrC_add_symbol((dmr_C *)src_local,(symbol_list **)&sym,sym_00);
    symiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&newsym);
  }
  return (symbol_list *)sym;
}

Assistant:

static struct symbol_list *copy_symbol_list(struct dmr_C *C, struct symbol_list *src)
{
	struct symbol_list *dst = NULL;
	struct symbol *sym;

	FOR_EACH_PTR(src, sym) {
		struct symbol *newsym = copy_symbol(C, sym->pos, sym);
		dmrC_add_symbol(C, &dst, newsym);
	} END_FOR_EACH_PTR(sym);
	return dst;
}